

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryMul<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryMul<FadExpr<FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>_>,_Fad<long_double>_>
            *this,int i)

{
  FadBinaryMinus<Fad<long_double>,_Fad<long_double>_>::fastAccessDx
            (*(FadBinaryMinus<Fad<long_double>,_Fad<long_double>_> **)__return_storage_ptr__,
             (int)this);
  return *(value_type **)(*(long *)__return_storage_ptr__ + 8);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}